

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMaker.h
# Opt level: O1

string * ApprovalTests::StringMaker::toString<char[62]>
                   (string *__return_storage_ptr__,char (*contents) [62])

{
  size_t sVar1;
  stringstream s;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  sVar1 = strlen(*contents);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,*contents,sVar1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(const T& contents)
        {
            std::stringstream s;
            s << contents;
            return s.str();
        }